

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_ghost(REF_GEOM ref_geom,REF_NODE ref_node)

{
  int iVar1;
  uint uVar2;
  REF_INT local_14c;
  undefined8 local_148;
  REF_INT local_140;
  int local_13c;
  REF_GLOB local_138;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_5;
  REF_INT ref_malloc_init_i_4;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT descr [6];
  REF_INT i;
  REF_INT geom;
  REF_INT item;
  REF_INT local;
  REF_INT *b_next;
  REF_INT *a_next;
  int local_a8;
  REF_INT degree;
  REF_INT node;
  REF_INT part;
  REF_DBL *b_param;
  REF_DBL *a_param;
  REF_GLOB global;
  REF_GLOB *b_descr;
  REF_GLOB *a_descr;
  REF_INT b_ngeom_total;
  REF_INT a_ngeom_total;
  REF_INT *b_ngeom;
  REF_INT *a_ngeom;
  REF_INT *b_part;
  REF_INT *a_part;
  REF_GLOB *b_global;
  REF_GLOB *a_global;
  REF_INT b_nnode_total;
  REF_INT a_nnode_total;
  REF_INT *b_nnode;
  REF_INT *a_nnode;
  REF_MPI ref_mpi;
  REF_NODE ref_node_local;
  REF_GEOM ref_geom_local;
  
  a_nnode = &ref_node->ref_mpi->n;
  if (((REF_MPI)a_nnode)->n < 2) {
    ref_geom_local._4_4_ = 0;
  }
  else {
    ref_mpi = (REF_MPI)ref_node;
    ref_node_local = (REF_NODE)ref_geom;
    if (((REF_MPI)a_nnode)->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe6a,
             "ref_geom_ghost","malloc a_next of REF_INT negative");
      ref_geom_local._4_4_ = 1;
    }
    else {
      b_next = (REF_INT *)malloc((long)((REF_MPI)a_nnode)->n << 2);
      if (b_next == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xe6a,"ref_geom_ghost","malloc a_next of REF_INT NULL");
        ref_geom_local._4_4_ = 2;
      }
      else {
        for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < *a_nnode;
            ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
          b_next[ref_malloc_init_i_2] = 0;
        }
        if (*a_nnode < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xe6b,"ref_geom_ghost","malloc b_next of REF_INT negative");
          ref_geom_local._4_4_ = 1;
        }
        else {
          _item = (undefined4 *)malloc((long)*a_nnode << 2);
          if (_item == (undefined4 *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xe6b,"ref_geom_ghost","malloc b_next of REF_INT NULL");
            ref_geom_local._4_4_ = 2;
          }
          else {
            for (ref_malloc_init_i_3 = 0; ref_malloc_init_i_3 < *a_nnode;
                ref_malloc_init_i_3 = ref_malloc_init_i_3 + 1) {
              _item[ref_malloc_init_i_3] = 0;
            }
            if (*a_nnode < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xe6c,"ref_geom_ghost","malloc a_nnode of REF_INT negative");
              ref_geom_local._4_4_ = 1;
            }
            else {
              b_nnode = (REF_INT *)malloc((long)*a_nnode << 2);
              if (b_nnode == (REF_INT *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xe6c,"ref_geom_ghost","malloc a_nnode of REF_INT NULL");
                ref_geom_local._4_4_ = 2;
              }
              else {
                for (ref_malloc_init_i_4 = 0; ref_malloc_init_i_4 < *a_nnode;
                    ref_malloc_init_i_4 = ref_malloc_init_i_4 + 1) {
                  b_nnode[ref_malloc_init_i_4] = 0;
                }
                if (*a_nnode < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xe6d,"ref_geom_ghost","malloc b_nnode of REF_INT negative");
                  ref_geom_local._4_4_ = 1;
                }
                else {
                  _b_nnode_total = (REF_INT *)malloc((long)*a_nnode << 2);
                  if (_b_nnode_total == (REF_INT *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0xe6d,"ref_geom_ghost","malloc b_nnode of REF_INT NULL");
                    ref_geom_local._4_4_ = 2;
                  }
                  else {
                    for (ref_malloc_init_i_5 = 0; ref_malloc_init_i_5 < *a_nnode;
                        ref_malloc_init_i_5 = ref_malloc_init_i_5 + 1) {
                      _b_nnode_total[ref_malloc_init_i_5] = 0;
                    }
                    if (*a_nnode < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0xe6e,"ref_geom_ghost","malloc a_ngeom of REF_INT negative");
                      ref_geom_local._4_4_ = 1;
                    }
                    else {
                      b_ngeom = (REF_INT *)malloc((long)*a_nnode << 2);
                      if (b_ngeom == (REF_INT *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0xe6e,"ref_geom_ghost","malloc a_ngeom of REF_INT NULL");
                        ref_geom_local._4_4_ = 2;
                      }
                      else {
                        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < *a_nnode;
                            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                          b_ngeom[ref_private_macro_code_rss] = 0;
                        }
                        if (*a_nnode < 0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                 ,0xe6f,"ref_geom_ghost","malloc b_ngeom of REF_INT negative");
                          ref_geom_local._4_4_ = 1;
                        }
                        else {
                          _b_ngeom_total = (REF_INT *)malloc((long)*a_nnode << 2);
                          if (_b_ngeom_total == (REF_INT *)0x0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                   ,0xe6f,"ref_geom_ghost","malloc b_ngeom of REF_INT NULL");
                            ref_geom_local._4_4_ = 2;
                          }
                          else {
                            for (ref_private_macro_code_rss_1 = 0;
                                ref_private_macro_code_rss_1 < *a_nnode;
                                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                              _b_ngeom_total[ref_private_macro_code_rss_1] = 0;
                            }
                            for (local_a8 = 0; local_a8 < ref_mpi->id; local_a8 = local_a8 + 1) {
                              if ((((-1 < local_a8) && (local_a8 < ref_mpi->id)) &&
                                  (-1 < *(long *)((long)ref_mpi->comm + (long)local_a8 * 8))) &&
                                 (a_nnode[1] !=
                                  *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)local_a8 * 4)
                                 )) {
                                iVar1 = *(int *)(*(long *)&ref_mpi->native_alltoallv +
                                                (long)local_a8 * 4);
                                b_nnode[iVar1] = b_nnode[iVar1] + 1;
                              }
                            }
                            uVar2 = ref_mpi_alltoall((REF_MPI)a_nnode,b_nnode,_b_nnode_total,1);
                            if (uVar2 == 0) {
                              a_global._4_4_ = 0;
                              for (degree = 0; degree < *a_nnode; degree = degree + 1) {
                                a_global._4_4_ = b_nnode[degree] + a_global._4_4_;
                              }
                              if (a_global._4_4_ < 0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                       ,0xe7c,"ref_geom_ghost",
                                       "malloc a_global of REF_GLOB negative");
                                ref_geom_local._4_4_ = 1;
                              }
                              else {
                                b_global = (REF_GLOB *)malloc((long)a_global._4_4_ << 3);
                                if (b_global == (REF_GLOB *)0x0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                         ,0xe7c,"ref_geom_ghost","malloc a_global of REF_GLOB NULL")
                                  ;
                                  ref_geom_local._4_4_ = 2;
                                }
                                else if (a_global._4_4_ < 0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                         ,0xe7d,"ref_geom_ghost","malloc a_part of REF_INT negative"
                                        );
                                  ref_geom_local._4_4_ = 1;
                                }
                                else {
                                  b_part = (REF_INT *)malloc((long)a_global._4_4_ << 2);
                                  if (b_part == (REF_INT *)0x0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                           ,0xe7d,"ref_geom_ghost","malloc a_part of REF_INT NULL");
                                    ref_geom_local._4_4_ = 2;
                                  }
                                  else {
                                    a_global._0_4_ = 0;
                                    for (degree = 0; degree < *a_nnode; degree = degree + 1) {
                                      a_global._0_4_ = _b_nnode_total[degree] + (int)a_global;
                                    }
                                    if ((int)a_global < 0) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                             ,0xe81,"ref_geom_ghost",
                                             "malloc b_global of REF_GLOB negative");
                                      ref_geom_local._4_4_ = 1;
                                    }
                                    else {
                                      a_part = (REF_INT *)malloc((long)(int)a_global << 3);
                                      if (a_part == (REF_INT *)0x0) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                               ,0xe81,"ref_geom_ghost",
                                               "malloc b_global of REF_GLOB NULL");
                                        ref_geom_local._4_4_ = 2;
                                      }
                                      else if ((int)a_global < 0) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                               ,0xe82,"ref_geom_ghost",
                                               "malloc b_part of REF_INT negative");
                                        ref_geom_local._4_4_ = 1;
                                      }
                                      else {
                                        a_ngeom = (REF_INT *)malloc((long)(int)a_global << 2);
                                        if (a_ngeom == (REF_INT *)0x0) {
                                          printf("%s: %d: %s: %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                 ,0xe82,"ref_geom_ghost",
                                                 "malloc b_part of REF_INT NULL");
                                          ref_geom_local._4_4_ = 2;
                                        }
                                        else {
                                          *b_next = 0;
                                          for (degree = 1; degree < *a_nnode; degree = degree + 1) {
                                            b_next[degree] =
                                                 b_next[degree + -1] + b_nnode[degree + -1];
                                          }
                                          for (local_a8 = 0; local_a8 < ref_mpi->id;
                                              local_a8 = local_a8 + 1) {
                                            if (((-1 < local_a8) && (local_a8 < ref_mpi->id)) &&
                                               ((-1 < *(long *)((long)ref_mpi->comm +
                                                               (long)local_a8 * 8) &&
                                                (a_nnode[1] !=
                                                 *(int *)(*(long *)&ref_mpi->native_alltoallv +
                                                         (long)local_a8 * 4))))) {
                                              degree = *(int *)(*(long *)&ref_mpi->native_alltoallv
                                                               + (long)local_a8 * 4);
                                              if (((local_a8 < 0) || (ref_mpi->id <= local_a8)) ||
                                                 (*(long *)((long)ref_mpi->comm + (long)local_a8 * 8
                                                           ) < 0)) {
                                                local_138 = -1;
                                              }
                                              else {
                                                local_138 = *(REF_GLOB *)
                                                             ((long)ref_mpi->comm +
                                                             (long)local_a8 * 8);
                                              }
                                              b_global[b_next[degree]] = local_138;
                                              b_part[b_next[degree]] = a_nnode[1];
                                              iVar1 = *(int *)(*(long *)&ref_mpi->native_alltoallv +
                                                              (long)local_a8 * 4);
                                              b_next[iVar1] = b_next[iVar1] + 1;
                                            }
                                          }
                                          uVar2 = ref_mpi_alltoallv((REF_MPI)a_nnode,b_global,
                                                                    b_nnode,a_part,_b_nnode_total,1,
                                                                    2);
                                          if (uVar2 == 0) {
                                            uVar2 = ref_mpi_alltoallv((REF_MPI)a_nnode,b_part,
                                                                      b_nnode,a_ngeom,_b_nnode_total
                                                                      ,1,1);
                                            if (uVar2 == 0) {
                                              for (local_a8 = 0; local_a8 < (int)a_global;
                                                  local_a8 = local_a8 + 1) {
                                                uVar2 = ::ref_node_local((REF_NODE)ref_mpi,
                                                                         *(REF_GLOB *)
                                                                          (a_part + (long)local_a8 *
                                                                                    2),&geom);
                                                if (uVar2 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xe9a,"ref_geom_ghost",(ulong)uVar2,"g2l");
                                                  return uVar2;
                                                }
                                                degree = a_ngeom[local_a8];
                                                uVar2 = ref_adj_degree((REF_ADJ)ref_node_local->
                                                                                unused_global,geom,
                                                                       (REF_INT *)
                                                                       ((long)&a_next + 4));
                                                if (uVar2 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xe9c,"ref_geom_ghost",(ulong)uVar2,"deg");
                                                  return uVar2;
                                                }
                                                _b_ngeom_total[degree] =
                                                     a_next._4_4_ + _b_ngeom_total[degree];
                                              }
                                              uVar2 = ref_mpi_alltoall((REF_MPI)a_nnode,
                                                                       _b_ngeom_total,b_ngeom,1);
                                              if (uVar2 == 0) {
                                                a_descr._4_4_ = 0;
                                                for (degree = 0; degree < *a_nnode;
                                                    degree = degree + 1) {
                                                  a_descr._4_4_ = b_ngeom[degree] + a_descr._4_4_;
                                                }
                                                if (a_descr._4_4_ * 6 < 0) {
                                                  printf("%s: %d: %s: %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xea7,"ref_geom_ghost",
                                                  "malloc a_descr of REF_GLOB negative");
                                                  ref_geom_local._4_4_ = 1;
                                                }
                                                else {
                                                  b_descr = (REF_GLOB *)
                                                            malloc((long)(a_descr._4_4_ * 6) << 3);
                                                  if (b_descr == (REF_GLOB *)0x0) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xea7,"ref_geom_ghost",
                                                  "malloc a_descr of REF_GLOB NULL");
                                                  ref_geom_local._4_4_ = 2;
                                                  }
                                                  else if (a_descr._4_4_ * 2 < 0) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xea8,"ref_geom_ghost",
                                                  "malloc a_param of REF_DBL negative");
                                                  ref_geom_local._4_4_ = 1;
                                                  }
                                                  else {
                                                    b_param = (REF_DBL *)
                                                              malloc((long)(a_descr._4_4_ << 1) << 3
                                                                    );
                                                    if (b_param == (REF_DBL *)0x0) {
                                                      printf("%s: %d: %s: %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xea8,"ref_geom_ghost",
                                                  "malloc a_param of REF_DBL NULL");
                                                  ref_geom_local._4_4_ = 2;
                                                  }
                                                  else {
                                                    a_descr._0_4_ = 0;
                                                    for (degree = 0; degree < *a_nnode;
                                                        degree = degree + 1) {
                                                      a_descr._0_4_ =
                                                           _b_ngeom_total[degree] + (int)a_descr;
                                                    }
                                                    if ((int)a_descr * 6 < 0) {
                                                      printf("%s: %d: %s: %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xeac,"ref_geom_ghost",
                                                  "malloc b_descr of REF_GLOB negative");
                                                  ref_geom_local._4_4_ = 1;
                                                  }
                                                  else {
                                                    global = (REF_GLOB)
                                                             malloc((long)((int)a_descr * 6) << 3);
                                                    if ((void *)global == (void *)0x0) {
                                                      printf("%s: %d: %s: %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xeac,"ref_geom_ghost",
                                                  "malloc b_descr of REF_GLOB NULL");
                                                  ref_geom_local._4_4_ = 2;
                                                  }
                                                  else if ((int)a_descr * 2 < 0) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xead,"ref_geom_ghost",
                                                  "malloc b_param of REF_DBL negative");
                                                  ref_geom_local._4_4_ = 1;
                                                  }
                                                  else {
                                                    _node = malloc((long)((int)a_descr << 1) << 3);
                                                    if (_node == (void *)0x0) {
                                                      printf("%s: %d: %s: %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xead,"ref_geom_ghost",
                                                  "malloc b_param of REF_DBL NULL");
                                                  ref_geom_local._4_4_ = 2;
                                                  }
                                                  else {
                                                    *_item = 0;
                                                    for (degree = 1; degree < *a_nnode;
                                                        degree = degree + 1) {
                                                      _item[degree] =
                                                           _item[degree + -1] +
                                                           _b_ngeom_total[degree + -1];
                                                    }
                                                    for (local_a8 = 0; local_a8 < (int)a_global;
                                                        local_a8 = local_a8 + 1) {
                                                      uVar2 = ::ref_node_local((REF_NODE)ref_mpi,
                                                                               *(REF_GLOB *)
                                                                                (a_part + (long)
                                                  local_a8 * 2),&geom);
                                                  if (uVar2 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xeb5,"ref_geom_ghost",(ulong)uVar2,"g2l");
                                                  return uVar2;
                                                  }
                                                  degree = a_ngeom[local_a8];
                                                  if ((geom < 0) ||
                                                     ((int)*ref_node_local->unused_global <= geom))
                                                  {
                                                    local_13c = -1;
                                                  }
                                                  else {
                                                    local_13c = *(int *)(ref_node_local->
                                                                         unused_global[1] +
                                                                        (long)geom * 4);
                                                  }
                                                  i = local_13c;
                                                  if (local_13c == -1) {
                                                    local_140 = -1;
                                                  }
                                                  else {
                                                    local_140 = *(REF_INT *)
                                                                 (ref_node_local->unused_global[2] +
                                                                  4 + (long)local_13c * 8);
                                                  }
                                                  descr[5] = local_140;
                                                  while (i != -1) {
                                                    for (descr[4] = 0; descr[4] < 6;
                                                        descr[4] = descr[4] + 1) {
                                                      *(long *)(global + (long)(descr[4] +
                                                                               _item[degree] * 6) *
                                                                         8) =
                                                           (long)*(int *)((long)ref_node_local->
                                                                                global +
                                                                         (long)(descr[4] +
                                                                               descr[5] * 6) * 4);
                                                    }
                                                    if (((*(int *)((long)ref_node_local->global +
                                                                  (long)(descr[5] * 6 + 5) * 4) < 0)
                                                        || (ref_mpi->id <=
                                                            *(int *)((long)ref_node_local->global +
                                                                    (long)(descr[5] * 6 + 5) * 4)))
                                                       || (*(long *)((long)ref_mpi->comm +
                                                                    (long)*(int *)((long)
                                                  ref_node_local->global +
                                                  (long)(descr[5] * 6 + 5) * 4) * 8) < 0)) {
                                                    local_148 = 0xffffffffffffffff;
                                                  }
                                                  else {
                                                    local_148 = *(undefined8 *)
                                                                 ((long)ref_mpi->comm +
                                                                 (long)*(int *)((long)ref_node_local
                                                                                      ->global +
                                                                               (long)(descr[5] * 6 +
                                                                                     5) * 4) * 8);
                                                  }
                                                  *(undefined8 *)
                                                   (global + (long)(_item[degree] * 6 + 5) * 8) =
                                                       local_148;
                                                  *(REF_GLOB *)
                                                   ((long)_node +
                                                   (long)(int)(_item[degree] << 1) * 8) =
                                                       ref_node_local->sorted_global[descr[5] << 1];
                                                  *(REF_GLOB *)
                                                   ((long)_node + (long)(_item[degree] * 2 + 1) * 8)
                                                       = ref_node_local->sorted_global
                                                         [descr[5] * 2 + 1];
                                                  _item[degree] = _item[degree] + 1;
                                                  i = *(int *)(ref_node_local->unused_global[2] +
                                                              (long)i * 8);
                                                  if (i == -1) {
                                                    local_14c = -1;
                                                  }
                                                  else {
                                                    local_14c = *(REF_INT *)
                                                                 (ref_node_local->unused_global[2] +
                                                                  4 + (long)i * 8);
                                                  }
                                                  descr[5] = local_14c;
                                                  }
                                                  }
                                                  uVar2 = ref_mpi_alltoallv((REF_MPI)a_nnode,
                                                                            (void *)global,
                                                                            _b_ngeom_total,b_descr,
                                                                            b_ngeom,6,2);
                                                  if (uVar2 == 0) {
                                                    uVar2 = ref_mpi_alltoallv((REF_MPI)a_nnode,_node
                                                                              ,_b_ngeom_total,
                                                                              b_param,b_ngeom,2,3);
                                                    if (uVar2 == 0) {
                                                      for (descr[5] = 0; descr[5] < a_descr._4_4_;
                                                          descr[5] = descr[5] + 1) {
                                                        for (descr[4] = 0; descr[4] < 6;
                                                            descr[4] = descr[4] + 1) {
                                                          (&ref_malloc_init_i_1)[descr[4]] =
                                                               (REF_INT)b_descr[descr[4] +
                                                                                descr[5] * 6];
                                                        }
                                                        a_param = (REF_DBL *)
                                                                  b_descr[descr[5] * 6 + 5];
                                                        uVar2 = ::ref_node_local((REF_NODE)ref_mpi,
                                                                                 (REF_GLOB)a_param,
                                                                                 &geom);
                                                        if (uVar2 != 0) {
                                                          printf("%s: %d: %s: %d %s\n",
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xed0,"ref_geom_ghost",(ulong)uVar2,"g2l");
                                                  return uVar2;
                                                  }
                                                  descr[3] = geom;
                                                  uVar2 = ref_geom_add_with_descr
                                                                    ((REF_GEOM)ref_node_local,
                                                                     &ref_malloc_init_i_1,
                                                                     b_param + (descr[5] << 1));
                                                  if (uVar2 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xed3,"ref_geom_ghost",(ulong)uVar2,"add ghost");
                                                  return uVar2;
                                                  }
                                                  }
                                                  free(_node);
                                                  free((void *)global);
                                                  free(b_param);
                                                  free(b_descr);
                                                  free(a_ngeom);
                                                  free(a_part);
                                                  free(b_part);
                                                  free(b_global);
                                                  free(_b_ngeom_total);
                                                  free(b_ngeom);
                                                  free(_b_nnode_total);
                                                  free(b_nnode);
                                                  free(_item);
                                                  free(b_next);
                                                  ref_geom_local._4_4_ = 0;
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xec9,"ref_geom_ghost",(ulong)uVar2,
                                                  "alltoallv param");
                                                  ref_geom_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xec6,"ref_geom_ghost",(ulong)uVar2,
                                                  "alltoallv descr");
                                                  ref_geom_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xea3,"ref_geom_ghost",(ulong)uVar2,
                                                  "alltoall ngeoms");
                                                ref_geom_local._4_4_ = uVar2;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xe97,"ref_geom_ghost",(ulong)uVar2,
                                                  "alltoallv global");
                                              ref_geom_local._4_4_ = uVar2;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                                  ,0xe94,"ref_geom_ghost",(ulong)uVar2,
                                                  "alltoallv global");
                                            ref_geom_local._4_4_ = uVar2;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                     ,0xe78,"ref_geom_ghost",(ulong)uVar2,"alltoall nnodes");
                              ref_geom_local._4_4_ = uVar2;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_ghost(REF_GEOM ref_geom, REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_nnode, *b_nnode;
  REF_INT a_nnode_total, b_nnode_total;
  REF_GLOB *a_global, *b_global;
  REF_INT *a_part, *b_part;
  REF_INT *a_ngeom, *b_ngeom;
  REF_INT a_ngeom_total, b_ngeom_total;
  REF_GLOB *a_descr, *b_descr;
  REF_GLOB global;
  REF_DBL *a_param, *b_param;
  REF_INT part, node, degree;
  REF_INT *a_next, *b_next;
  REF_INT local, item, geom, i;
  REF_INT descr[REF_GEOM_DESCR_SIZE];

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_ngeom, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_ngeom, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      a_nnode[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_nnode, b_nnode, REF_INT_TYPE),
      "alltoall nnodes");

  a_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_nnode_total += a_nnode[part];
  ref_malloc(a_global, a_nnode_total, REF_GLOB);
  ref_malloc(a_part, a_nnode_total, REF_INT);

  b_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_nnode_total += b_nnode[part];
  ref_malloc(b_global, b_nnode_total, REF_GLOB);
  ref_malloc(b_part, b_nnode_total, REF_INT);

  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_nnode[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_part[a_next[part]] = ref_mpi_rank(ref_mpi);
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_nnode, b_global, b_nnode, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");
  RSS(ref_mpi_alltoallv(ref_mpi, a_part, a_nnode, b_part, b_nnode, 1,
                        REF_INT_TYPE),
      "alltoallv global");

  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    RSS(ref_adj_degree(ref_geom_adj(ref_geom), local, &degree), "deg");
    /* printf("%d: node %d global %d local %d part %d degree %d\n",
       ref_mpi_rank(ref_mpi), node,b_global[node], local, part, degree); */
    b_ngeom[part] += degree;
  }

  RSS(ref_mpi_alltoall(ref_mpi, b_ngeom, a_ngeom, REF_INT_TYPE),
      "alltoall ngeoms");

  a_ngeom_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_ngeom_total += a_ngeom[part];
  ref_malloc(a_descr, REF_GEOM_DESCR_SIZE * a_ngeom_total, REF_GLOB);
  ref_malloc(a_param, 2 * a_ngeom_total, REF_DBL);

  b_ngeom_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_ngeom_total += b_ngeom[part];
  ref_malloc(b_descr, REF_GEOM_DESCR_SIZE * b_ngeom_total, REF_GLOB);
  ref_malloc(b_param, 2 * b_ngeom_total, REF_DBL);

  b_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    b_next[part] = b_next[part - 1] + b_ngeom[part - 1];
  }

  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    each_ref_geom_having_node(ref_geom, local, item, geom) {
      each_ref_descr(ref_geom, i) {
        b_descr[i + REF_GEOM_DESCR_SIZE * b_next[part]] =
            (REF_GLOB)ref_geom_descr(ref_geom, i, geom);
      }
      b_descr[REF_GEOM_DESCR_NODE + REF_GEOM_DESCR_SIZE * b_next[part]] =
          ref_node_global(ref_node, ref_geom_node(ref_geom, geom));
      b_param[0 + 2 * b_next[part]] = ref_geom_param(ref_geom, 0, geom);
      b_param[1 + 2 * b_next[part]] = ref_geom_param(ref_geom, 1, geom);
      b_next[part]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_descr, b_ngeom, a_descr, a_ngeom,
                        REF_GEOM_DESCR_SIZE, REF_GLOB_TYPE),
      "alltoallv descr");
  RSS(ref_mpi_alltoallv(ref_mpi, b_param, b_ngeom, a_param, a_ngeom, 2,
                        REF_DBL_TYPE),
      "alltoallv param");

  for (geom = 0; geom < a_ngeom_total; geom++) {
    each_ref_descr(ref_geom, i) {
      descr[i] = (REF_INT)a_descr[i + REF_GEOM_DESCR_SIZE * geom];
    }
    global = a_descr[REF_GEOM_DESCR_NODE + REF_GEOM_DESCR_SIZE * geom];
    RSS(ref_node_local(ref_node, global, &local), "g2l");
    descr[REF_GEOM_DESCR_NODE] = local;
    RSS(ref_geom_add_with_descr(ref_geom, descr, &(a_param[2 * geom])),
        "add ghost");
  }

  free(b_param);
  free(b_descr);
  free(a_param);
  free(a_descr);
  free(b_part);
  free(b_global);
  free(a_part);
  free(a_global);
  free(b_ngeom);
  free(a_ngeom);
  free(b_nnode);
  free(a_nnode);
  free(b_next);
  free(a_next);

  return REF_SUCCESS;
}